

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall
asmjit::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneHeap *heap,size_t newLength,size_t idealCapacity,
          bool newBitsValue)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong uVar6;
  size_t unaff_RBX;
  uint uVar7;
  ulong unaff_RBP;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  void *unaff_R13;
  void *__src;
  ZoneBitVector *unaff_R14;
  ulong uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  size_t allocatedCapacity;
  uint local_44;
  void *local_40;
  ulong local_38;
  
  uVar10 = (ulong)newBitsValue;
  if (idealCapacity < newLength) {
    _resize();
    __src = unaff_R13;
LAB_001753d1:
    local_40 = __src;
    bVar2 = false;
LAB_00175277:
    __src = local_40;
    if (!bVar2) {
      return 1;
    }
LAB_00175284:
    uVar4 = unaff_RBP >> 6;
    uVar3 = (uint)unaff_RBX & 0x3f;
    uVar11 = (ulong)uVar3;
    if ((unaff_RBP & 0x3f) != 0) {
      uVar7 = (uint)(unaff_RBP & 0x3f);
      uVar8 = 0;
      if ((uVar4 == unaff_RBX >> 6) && (uVar8 = uVar3, uVar3 <= uVar7)) {
        _resize();
        goto LAB_001753fb;
      }
      puVar5 = (ulong *)((long)__src + uVar4 * 8);
      *puVar5 = *puVar5 | -(uVar10 & 0xff) << ((ulong)(uVar8 - uVar7) & 0x3f);
      uVar4 = uVar4 + 1;
    }
    uVar10 = unaff_RBX + 0x40 >> 6;
    lVar1 = uVar10 - 1;
    uVar6 = (ulong)(lVar1 * 0x40 == unaff_RBX);
    uVar9 = lVar1 - uVar6;
    if (uVar4 <= uVar9) {
      uVar10 = uVar10 - uVar6;
      if (uVar10 <= uVar4 + 1) {
        uVar10 = uVar4 + 1;
      }
      auVar12 = vpbroadcastq_avx512f();
      auVar13 = vpbroadcastq_avx512f();
      uVar6 = 0;
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar15 = vpbroadcastq_avx512f();
        auVar15 = vporq_avx512f(auVar15,auVar14);
        vpcmpuq_avx512f(auVar15,auVar12,2);
        auVar15 = vmovdqu64_avx512f(auVar13);
        *(undefined1 (*) [64])((long)__src + uVar6 * 8 + uVar4 * 8) = auVar15;
        uVar6 = uVar6 + 8;
      } while (((uVar10 - uVar4) + 7 & 0xfffffffffffffff8) != uVar6);
    }
    newLength = unaff_RBX;
    this = unaff_R14;
    if (uVar11 == 0) goto LAB_00175381;
    puVar5 = (ulong *)((long)__src + uVar9 * 8);
  }
  else {
    unaff_RBP = *(ulong *)(this + 8);
    if (unaff_RBP < newLength) {
      __src = *(void **)this;
      unaff_RBX = newLength;
      unaff_R14 = this;
      if (newLength <= *(ulong *)(this + 0x10)) goto LAB_00175284;
      uVar11 = idealCapacity + 0x3f & 0xffffffffffffffc0;
      if (uVar11 < newLength) goto LAB_001753d1;
      if (heap->_zone == (Zone *)0x0) {
        _resize();
        __src = local_40;
LAB_001753dd:
        local_40 = __src;
        bVar2 = false;
        uVar10 = (ulong)local_44;
        goto LAB_00175277;
      }
      local_44 = (uint)newBitsValue;
      local_40 = ZoneHeap::_alloc(heap,uVar11 >> 3,&local_38);
      if (local_40 == (void *)0x0) goto LAB_001753dd;
      uVar4 = local_38 * 8;
      if (local_38 * 8 < local_38) {
        uVar4 = uVar11;
      }
      if (unaff_RBP != 0) {
        memcpy(local_40,__src,(unaff_RBP + 0x40 >> 6) - 1);
      }
      if (__src == (void *)0x0) {
LAB_0017526e:
        *(void **)this = local_40;
        *(ulong *)(this + 0x10) = uVar4;
        bVar2 = true;
        goto LAB_00175277;
      }
      if (heap->_zone != (Zone *)0x0) {
        if (*(ulong *)(this + 0x10) < 8) goto LAB_00175400;
        _resize();
        goto LAB_0017526e;
      }
LAB_001753fb:
      _resize();
LAB_00175400:
      _resize();
    }
    uVar11 = newLength & 0x3f;
    if (uVar11 == 0) goto LAB_00175381;
    puVar5 = (ulong *)((newLength >> 6) * 8 + *(long *)this);
  }
  *puVar5 = *puVar5 & ~(-1L << uVar11);
LAB_00175381:
  *(size_t *)(this + 8) = newLength;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneHeap* heap, size_t newLength, size_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newLength);

  if (newLength <= _length) {
    // The size after the resize is lesser than or equal to the current length.
    size_t idx = newLength / kBitsPerWord;
    size_t bit = newLength % kBitsPerWord;

    // Just set all bits outside of the new length in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newLength` is a multiply of `kBitsPerWord` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_length`.
    if (bit)
      _data[idx] &= (static_cast<uintptr_t>(1) << bit) - 1U;

    _length = newLength;
    return kErrorOk;
  }

  size_t oldLength = _length;
  BitWord* data = _data;

  if (newLength > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) requied.
    size_t minimumCapacityInBits = Utils::alignTo<size_t>(idealCapacity, kBitsPerWord);
    size_t allocatedCapacity;

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newLength))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // Normalize to bytes.
    size_t minimumCapacity = minimumCapacityInBits / 8;
    BitWord* newData = static_cast<BitWord*>(heap->alloc(minimumCapacity, allocatedCapacity));

    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorNoHeapMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_heap->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (oldLength)
      ::memcpy(newData, data, _wordsPerBits(oldLength));

    if (data)
      heap->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = allocatedCapacityInBits;
  }

  // Start (of the old length) and end (of the new length) bits
  size_t idx = oldLength / kBitsPerWord;
  size_t startBit = oldLength % kBitsPerWord;
  size_t endBit = newLength % kBitsPerWord;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = _patternFromBit(newBitsValue);

  // First initialize the last bit-word of the old length.
  if (startBit) {
    size_t nBits = 0;

    if (idx == (newLength / kBitsPerWord)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old length.
      nBits = kBitsPerWord - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old length.
  size_t endIdx = _wordsPerBits(newLength);
  endIdx -= static_cast<size_t>(endIdx * kBitsPerWord == newLength);

  while (idx <= endIdx)
    data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx] &= (static_cast<BitWord>(1) << endBit) - 1;

  _length = newLength;
  return kErrorOk;
}